

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_min>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [16];
  uint uVar5;
  undefined1 (*pauVar6) [16];
  int iVar7;
  uint uVar8;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  
  uVar2 = a->c;
  uVar5 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar7 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        pauVar4 = (undefined1 (*) [16])(a->cstep * uVar3 * a->elemsize + (long)a->data);
        pauVar6 = (undefined1 (*) [16])(c->cstep * uVar3 * c->elemsize + (long)c->data);
        fVar1 = *b->data;
        if ((int)uVar5 < 4) {
          uVar8 = 0;
        }
        else {
          iVar7 = 3;
          do {
            auVar11._4_4_ = fVar1;
            auVar11._0_4_ = fVar1;
            auVar11._8_4_ = fVar1;
            auVar11._12_4_ = fVar1;
            auVar11 = minps(*pauVar4,auVar11);
            *pauVar6 = auVar11;
            pauVar4 = pauVar4 + 1;
            pauVar6 = pauVar6 + 1;
            iVar7 = iVar7 + 4;
            uVar8 = uVar5 & 0xfffffffc;
          } while (iVar7 < (int)uVar5);
        }
        if (uVar5 - uVar8 != 0 && (int)uVar8 <= (int)uVar5) {
          lVar9 = 0;
          do {
            fVar10 = *(float *)(*pauVar4 + lVar9 * 4);
            if (fVar1 <= *(float *)(*pauVar4 + lVar9 * 4)) {
              fVar10 = fVar1;
            }
            *(float *)((long)*pauVar6 + lVar9 * 4) = fVar10;
            lVar9 = lVar9 + 1;
          } while (uVar5 - uVar8 != (int)lVar9);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar2);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}